

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O2

void __thiscall ProjectWriter::writeOptions(ProjectWriter *this)

{
  undefined1 *puVar1;
  string local_48;
  
  puVar1 = &this->field_0x18;
  std::operator<<((ostream *)puVar1,"\n[OPTIONS]\n");
  Options::hydOptionsToStr_abi_cxx11_(&local_48,&this->network->options);
  std::operator<<((ostream *)puVar1,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator<<((ostream *)puVar1,"\n");
  Options::demandOptionsToStr_abi_cxx11_(&local_48,&this->network->options);
  std::operator<<((ostream *)puVar1,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator<<((ostream *)puVar1,"\n");
  Options::qualOptionsToStr_abi_cxx11_(&local_48,&this->network->options);
  std::operator<<((ostream *)puVar1,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void ProjectWriter::writeOptions()
{
    fout << "\n[OPTIONS]\n";
    fout << network->options.hydOptionsToStr();
    fout << "\n";
    fout << network->options.demandOptionsToStr();
    fout << "\n";
    fout << network->options.qualOptionsToStr();
}